

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_new.c
# Opt level: O3

LY_ERR lyd_new_ext_any(lysc_ext_instance *ext,char *name,void *value,
                      LYD_ANYDATA_VALUETYPE value_type,uint32_t options,lyd_node **node)

{
  LY_ERR LVar1;
  lysc_node *schema;
  char *format;
  ly_ctx *ctx;
  char *pcVar2;
  lyd_node *ret;
  lyd_node *local_38;
  
  local_38 = (lyd_node *)0x0;
  if (ext == (lysc_ext_instance *)0x0) {
    pcVar2 = "ext";
    ctx = (ly_ctx *)0x0;
  }
  else {
    ctx = ext->module->ctx;
    if (node == (lyd_node **)0x0) {
      pcVar2 = "node";
    }
    else {
      if (name != (char *)0x0) {
        schema = lysc_ext_find_node(ext,(lys_module *)0x0,name,0,0x60,0);
        if (schema == (lysc_node *)0x0) {
          pcVar2 = ext->def->name;
          if (ext->argument == (char *)0x0) {
            format = "Any node \"%s\" not found in instance of extension %s.";
          }
          else {
            format = "Any node \"%s\" not found in instance \"%s\" of extension %s.";
            pcVar2 = ext->argument;
          }
          ly_log(ctx,LY_LLERR,LY_EINVAL,format,name,pcVar2);
          return LY_ENOTFOUND;
        }
        LVar1 = lyd_create_any(schema,value,value_type,(byte)(options >> 8) & 1,&local_38);
        if (LVar1 != LY_SUCCESS) {
          return LVar1;
        }
        *node = local_38;
        return LY_SUCCESS;
      }
      pcVar2 = "name";
    }
  }
  ly_log(ctx,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",pcVar2,"lyd_new_ext_any");
  return LY_EINVAL;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyd_new_ext_any(const struct lysc_ext_instance *ext, const char *name, const void *value, LYD_ANYDATA_VALUETYPE value_type,
        uint32_t options, struct lyd_node **node)
{
    struct lyd_node *ret = NULL;
    const struct lysc_node *schema;
    struct ly_ctx *ctx = ext ? ext->module->ctx : NULL;
    ly_bool use_value = (options & LYD_NEW_ANY_USE_VALUE) ? 1 : 0;

    LY_CHECK_ARG_RET(ctx, ext, node, name, LY_EINVAL);

    schema = lysc_ext_find_node(ext, NULL, name, 0, LYD_NODE_ANY, 0);
    if (!schema) {
        if (ext->argument) {
            LOGERR(ctx, LY_EINVAL, "Any node \"%s\" not found in instance \"%s\" of extension %s.",
                    name, ext->argument, ext->def->name);
        } else {
            LOGERR(ctx, LY_EINVAL, "Any node \"%s\" not found in instance of extension %s.", name, ext->def->name);
        }
        return LY_ENOTFOUND;
    }
    LY_CHECK_RET(lyd_create_any(schema, value, value_type, use_value, &ret));

    *node = ret;

    return LY_SUCCESS;
}